

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::maxwell_dist<float>::icdf(maxwell_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  int iVar2;
  result_type_conflict1 rVar3;
  result_type_conflict1 rVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (0.0 <= x) {
    if (x <= 1.0) {
      if ((x == 1.0) && (!NAN(x))) {
        return INFINITY;
      }
      if ((x == 0.0) && (!NAN(x))) {
        return 0.0;
      }
      fVar6 = (this->P).theta_;
      iVar2 = 0x1b;
      fVar6 = (fVar6 + fVar6) * 0.7978846;
      do {
        iVar2 = iVar2 + -1;
        if (iVar2 == 0) {
          return fVar6;
        }
        rVar3 = cdf(this,fVar6);
        rVar4 = pdf(this,fVar6);
        fVar5 = fVar6 - (rVar3 - x) / rVar4;
        fVar7 = fVar5 / fVar6;
        fVar6 = fVar5;
      } while (4.7683716e-07 <= ABS(fVar7 + -1.0));
      return fVar5;
    }
  }
  piVar1 = __errno_location();
  *piVar1 = 0x21;
  return NAN;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      if (x == 0)
        return 0;
      result_type y(2 * P.theta() * math::constants<result_type>::sqrt_2_over_pi);
      for (int i{0}; i < math::numeric_limits<result_type>::digits + 2; ++i) {
        result_type y_old = y;
        y -= (cdf(y) - x) / pdf(y);
        if (math::abs(y / y_old - 1) < 4 * math::numeric_limits<result_type>::epsilon())
          break;
      }
      return y;
    }